

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O3

value_type __thiscall
FadBinaryPow<Fad<double>,_Fad<double>_>::dx(FadBinaryPow<Fad<double>,_Fad<double>_> *this,int i)

{
  double dVar1;
  double __y;
  double dVar2;
  double __x;
  Fad<double> *pFVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  
  pFVar3 = this->right_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar1 = *pdVar4;
  dVar5 = log(this->left_->val_);
  pFVar3 = this->left_;
  __y = this->right_->val_;
  pdVar4 = &pFVar3->defaultVal;
  if ((pFVar3->dx_).num_elts != 0) {
    pdVar4 = (pFVar3->dx_).ptr_to_data + i;
  }
  dVar2 = *pdVar4;
  __x = pFVar3->val_;
  dVar6 = pow(__x,__y);
  return dVar6 * (dVar5 * dVar1 + (dVar2 * __y) / __x);
}

Assistant:

const value_type dx(int i) const 
    {
      return  (right_.dx(i)*log(left_.val())+right_.val()*left_.dx(i)/left_.val())
	*pow( left_.val(), right_.val() );
    }